

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  color_quad_u8 *local_b0;
  bool local_9d;
  uint uStack_98;
  bool success;
  uint trial_error;
  uint best_error;
  uint best_selector_index;
  color_quad_u8 *src_pixel;
  color_quad_u8 *pcStack_80;
  uint c;
  color_quad_u8 *pSrc_pixels;
  uint64 total_error;
  int yd;
  uint s;
  color_quad_u8 block_colors [4];
  int *pInten_table;
  uint inten_table;
  uint n;
  color_quad_u8 base_color;
  int db;
  int dg;
  int dr;
  potential_solution *pBest_solution_local;
  potential_solution *trial_solution_local;
  etc1_solution_coordinates *coords_local;
  etc1_optimizer *this_local;
  
  trial_solution->m_valid = false;
  if ((this->m_pParams->m_constrain_against_base_color5 & 1U) != 0) {
    iVar1 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(this->m_pParams->m_base_color5).field_0.field_0.r;
    base_color.field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         ((uint)(coords->m_unscaled_color).field_0.field_0.g -
         (uint)(this->m_pParams->m_base_color5).field_0.field_0.g);
    n = (uint)(coords->m_unscaled_color).field_0.field_0.b -
        (uint)(this->m_pParams->m_base_color5).field_0.field_0.b;
    iVar2 = minimum<int>(iVar1,(int)base_color.field_0,n);
    if ((iVar2 < -4) || (iVar1 = maximum<int>(iVar1,(int)base_color.field_0,n), 3 < iVar1)) {
      return false;
    }
  }
  etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&inten_table);
  trial_solution->m_error = 0xffffffffffffffff;
  pInten_table._0_4_ = 0;
  do {
    if (7 < (uint)pInten_table) {
      color_quad_u8::operator=((color_quad_u8 *)trial_solution,&coords->m_unscaled_color);
      (trial_solution->m_coords).m_color4 = (bool)(this->m_pParams->m_use_color4 & 1);
      local_9d = false;
      if ((pBest_solution != (potential_solution *)0x0) &&
         (local_9d = trial_solution->m_error < pBest_solution->m_error, local_9d)) {
        potential_solution::operator=(pBest_solution,trial_solution);
      }
      return local_9d;
    }
    local_b0 = (color_quad_u8 *)&yd;
    do {
      color_quad_u8::color_quad_u8(local_b0);
      local_b0 = local_b0 + 1;
    } while (local_b0 != block_colors + 2);
    for (total_error._4_4_ = 0; total_error._4_4_ < 4; total_error._4_4_ = total_error._4_4_ + 1) {
      iVar1 = *(int *)(g_etc1_inten_tables +
                      (ulong)total_error._4_4_ * 4 + (ulong)(uint)pInten_table * 0x10);
      color_quad_u8::set((color_quad_u8 *)(&yd + total_error._4_4_),(uint)(byte)inten_table + iVar1,
                         (uint)inten_table._1_1_ + iVar1,(uint)inten_table._2_1_ + iVar1,0);
    }
    pSrc_pixels = (color_quad_u8 *)0x0;
    pcStack_80 = this->m_pParams->m_pSrc_pixels;
    for (src_pixel._4_4_ = 0; src_pixel._4_4_ < 8; src_pixel._4_4_ = src_pixel._4_4_ + 1) {
      iVar1 = square<int>((uint)(pcStack_80->field_0).field_0.r - (uint)(byte)yd);
      iVar2 = square<int>((uint)(pcStack_80->field_0).field_0.g - (uint)yd._1_1_);
      iVar3 = square<int>((uint)(pcStack_80->field_0).field_0.b - (uint)yd._2_1_);
      uStack_98 = iVar1 + iVar2 + iVar3;
      iVar1 = square<int>((uint)(pcStack_80->field_0).field_0.r - (uint)(byte)s);
      iVar2 = square<int>((uint)(pcStack_80->field_0).field_0.g - (uint)s._1_1_);
      iVar3 = square<int>((uint)(pcStack_80->field_0).field_0.b - (uint)s._2_1_);
      uVar4 = iVar1 + iVar2 + iVar3;
      trial_error._0_1_ = uVar4 < uStack_98;
      if ((bool)(uint8)trial_error) {
        uStack_98 = uVar4;
      }
      iVar1 = square<int>((uint)(pcStack_80->field_0).field_0.r -
                          (uint)(byte)block_colors[0].field_0._0_1_);
      iVar2 = square<int>((uint)(pcStack_80->field_0).field_0.g -
                          (uint)(byte)block_colors[0].field_0._1_1_);
      iVar3 = square<int>((uint)(pcStack_80->field_0).field_0.b -
                          (uint)(byte)block_colors[0].field_0._2_1_);
      uVar4 = iVar1 + iVar2 + iVar3;
      if (uVar4 < uStack_98) {
        trial_error._0_1_ = '\x02';
        uStack_98 = uVar4;
      }
      iVar1 = square<int>((uint)(pcStack_80->field_0).field_0.r -
                          (uint)(byte)block_colors[1].field_0._0_1_);
      iVar2 = square<int>((uint)(pcStack_80->field_0).field_0.g -
                          (uint)(byte)block_colors[1].field_0._1_1_);
      iVar3 = square<int>((uint)(pcStack_80->field_0).field_0.b -
                          (uint)(byte)block_colors[1].field_0._2_1_);
      uVar4 = iVar1 + iVar2 + iVar3;
      if (uVar4 < uStack_98) {
        trial_error._0_1_ = '\x03';
        uStack_98 = uVar4;
      }
      this->m_temp_selectors[src_pixel._4_4_] = (uint8)trial_error;
      pSrc_pixels = (color_quad_u8 *)((pSrc_pixels->field_0).c + uStack_98);
      if ((color_quad_u8 *)trial_solution->m_error <= pSrc_pixels) break;
      pcStack_80 = pcStack_80 + 1;
    }
    if (pSrc_pixels < (color_quad_u8 *)trial_solution->m_error) {
      trial_solution->m_error = (uint64)pSrc_pixels;
      (trial_solution->m_coords).m_inten_table = (uint)pInten_table;
      *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
      trial_solution->m_valid = true;
    }
    pInten_table._0_4_ = (uint)pInten_table + 1;
  } while( true );
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = rg_etc1::square(src_pixel.r - block_colors[0].r) + rg_etc1::square(src_pixel.g - block_colors[0].g) + rg_etc1::square(src_pixel.b - block_colors[0].b);

      uint trial_error = rg_etc1::square(src_pixel.r - block_colors[1].r) + rg_etc1::square(src_pixel.g - block_colors[1].g) + rg_etc1::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[2].r) + rg_etc1::square(src_pixel.g - block_colors[2].g) + rg_etc1::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[3].r) + rg_etc1::square(src_pixel.g - block_colors[3].g) + rg_etc1::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, 8);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}